

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial_device.cpp
# Opt level: O1

float embree::getTextureTexel1f(Texture *texture,float s,float t)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  
  fVar5 = 0.0;
  if (texture != (Texture *)0x0) {
    uVar1 = texture->width;
    uVar2 = texture->height;
    fVar5 = floorf((float)uVar1 * s);
    iVar4 = ((int)((uint)(int)fVar5 % uVar1) >> 0x1f & uVar1) + (uint)(int)fVar5 % uVar1;
    fVar5 = floorf((float)uVar2 * t);
    iVar3 = ((int)((uint)(int)fVar5 % uVar2) >> 0x1f & uVar2) + (uint)(int)fVar5 % uVar2;
    if (texture->format == RGBA8) {
      fVar5 = (float)*(byte *)((long)texture->data + (long)(int)((iVar3 * uVar1 + iVar4) * 4)) *
              0.003921569;
    }
    else {
      fVar5 = 0.0;
      if (texture->format == FLOAT32) {
        fVar5 = *(float *)((long)texture->data + (ulong)(iVar3 * uVar1 + iVar4) * 4);
      }
    }
  }
  return fVar5;
}

Assistant:

float getTextureTexel1f(const Texture* texture, float s, float t)
{
  if (!texture) return 0.0f;

  int iu = (int)floor(s * (float)(texture->width));
  iu = iu % texture->width; if (iu < 0) iu += texture->width;
  int iv = (int)floor(t * (float)(texture->height));
  iv = iv % texture->height; if (iv < 0) iv += texture->height;

  if (texture->format == Texture::FLOAT32)
  {
    float *data = (float *)texture->data;
    return data[iv*texture->width + iu];
  }
  else if (texture->format == Texture::RGBA8)
  {
    const int offset = (iv * texture->width + iu) * 4;
    unsigned char * t = (unsigned char*)texture->data;
    return t[offset+0]*(1.0f/255.0f);
  }
  return 0.0f;
}